

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_create_map_iterator(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int iVar1;
  JSValueUnion JVar2;
  ulong uVar3;
  JSValueUnion *pJVar4;
  JSClassID class_id;
  ulong uVar5;
  ulong uVar6;
  uint class_id_00;
  JSValueUnion JVar7;
  JSRefCountHeader *p;
  JSValue JVar8;
  JSValue JVar9;
  
  JVar7 = this_val.u;
  class_id_00 = (magic & 3U) + 0x1f;
  if ((((int)this_val.tag == -1) && (class_id_00 == *(ushort *)((long)JVar7.ptr + 6))) &&
     (*(long *)((long)JVar7.ptr + 0x30) != 0)) {
    class_id = (magic & 3U) + 0x23;
    uVar3 = (ulong)(class_id * 0x10);
    JVar8.tag = *(int64_t *)((long)&ctx->class_proto->tag + uVar3);
    JVar8.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto->u + uVar3))->ptr;
    JVar8 = JS_NewObjectProtoClass(ctx,JVar8,class_id);
    uVar6 = JVar8.tag;
    JVar2 = JVar8.u;
    if ((uVar6 & 0xffffffff) != 6) {
      pJVar4 = (JSValueUnion *)js_malloc(ctx,0x20);
      if (pJVar4 != (JSValueUnion *)0x0) {
        *(int *)JVar7.ptr = *JVar7.ptr + 1;
        pJVar4->ptr = (void *)JVar7;
        pJVar4[1] = (JSValueUnion)this_val.tag;
        pJVar4[2].int32 = magic >> 2;
        pJVar4[3].float64 = 0.0;
        if ((uint)JVar8.tag == 0xffffffff) {
          *(JSValueUnion **)((long)JVar2.ptr + 0x30) = pJVar4;
        }
        uVar5 = (ulong)JVar2.ptr & 0xffffffff00000000;
        uVar3 = (ulong)JVar2.ptr & 0xffffffff;
        goto LAB_001456f4;
      }
      if ((0xfffffff4 < (uint)JVar8.tag) &&
         (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar8);
      }
    }
    uVar3 = 0;
    uVar5 = 0;
    uVar6 = 6;
  }
  else {
    JS_ThrowTypeErrorInvalidClass(ctx,class_id_00);
    uVar6 = 6;
    uVar3 = 0;
    uVar5 = 0;
  }
LAB_001456f4:
  JVar9.u.ptr = (void *)(uVar3 | uVar5);
  JVar9.tag = uVar6;
  return JVar9;
}

Assistant:

static JSValue js_create_map_iterator(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv, int magic)
{
    JSIteratorKindEnum kind;
    JSMapState *s;
    JSMapIteratorData *it;
    JSValue enum_obj;

    kind = magic >> 2;
    magic &= 3;
    s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    if (!s)
        return JS_EXCEPTION;
    enum_obj = JS_NewObjectClass(ctx, JS_CLASS_MAP_ITERATOR + magic);
    if (JS_IsException(enum_obj))
        goto fail;
    it = js_malloc(ctx, sizeof(*it));
    if (!it) {
        JS_FreeValue(ctx, enum_obj);
        goto fail;
    }
    it->obj = JS_DupValue(ctx, this_val);
    it->kind = kind;
    it->cur_record = NULL;
    JS_SetOpaque(enum_obj, it);
    return enum_obj;
 fail:
    return JS_EXCEPTION;
}